

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O3

ScenarioUpperBound * __thiscall
despot::SimpleRockSample::CreateScenarioUpperBound
          (SimpleRockSample *this,string *name,string particle_bound_name)

{
  int iVar1;
  SimpleRockSampleParticleUpperBound *this_00;
  TrivialParticleUpperBound *this_01;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_00 = (SimpleRockSampleParticleUpperBound *)operator_new(0x20);
      SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
                (this_00,&this->super_DSPOMDP);
      return (ScenarioUpperBound *)this_00;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(0);
  }
  this_01 = (TrivialParticleUpperBound *)operator_new(0x10);
  despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_01,&this->super_DSPOMDP);
  return (ScenarioUpperBound *)this_01;
}

Assistant:

ScenarioUpperBound* SimpleRockSample::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	ScenarioUpperBound* bound = NULL;
	if (name == "TRIVIAL" || name == "DEFAULT") {
		bound = new TrivialParticleUpperBound(this);
	} else if (name == "MAX") {
		bound = new SimpleRockSampleParticleUpperBound(this);
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(0);
	}
	return bound;
}